

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O1

void aom_noise_tx_filter(aom_noise_tx_t *noise_tx,float *psd)

{
  float fVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  int x;
  long lVar5;
  float fVar6;
  float fVar7;
  
  lVar2 = (long)noise_tx->block_size;
  if (0 < lVar2) {
    pfVar3 = noise_tx->tx_block + 1;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        fVar1 = pfVar3[lVar5 * 2 + -1];
        fVar6 = ABS(fVar1);
        if (fVar6 <= 1e-08) {
          fVar6 = 1e-08;
        }
        fVar7 = ABS(pfVar3[lVar5 * 2]);
        if (fVar7 <= 1e-08) {
          fVar7 = 1e-08;
        }
        fVar6 = fVar6 * fVar6 + fVar7 * fVar7;
        if ((fVar6 <= psd[lVar5] * 1.1) || (fVar6 <= 1e-06)) {
          pfVar3[lVar5 * 2 + -1] = fVar1 * 0.09090911;
          fVar7 = 0.09090911;
        }
        else {
          fVar7 = fVar6;
          if (fVar6 <= 1e-06) {
            fVar7 = 1e-06;
          }
          pfVar3[lVar5 * 2 + -1] = fVar1 * ((fVar6 - psd[lVar5]) / fVar7);
          fVar7 = (fVar6 - psd[lVar5]) / fVar7;
        }
        pfVar3[lVar5 * 2] = fVar7 * pfVar3[lVar5 * 2];
        lVar5 = lVar5 + 1;
      } while (lVar2 != lVar5);
      lVar4 = lVar4 + 1;
      psd = psd + lVar2;
      pfVar3 = pfVar3 + lVar2 * 2;
    } while (lVar4 != lVar2);
  }
  return;
}

Assistant:

void aom_noise_tx_filter(struct aom_noise_tx_t *noise_tx, const float *psd) {
  const int block_size = noise_tx->block_size;
  const float kBeta = 1.1f;
  const float kEps = 1e-6f;
  for (int y = 0; y < block_size; ++y) {
    for (int x = 0; x < block_size; ++x) {
      int i = y * block_size + x;
      float *c = noise_tx->tx_block + 2 * i;
      const float c0 = AOMMAX((float)fabs(c[0]), 1e-8f);
      const float c1 = AOMMAX((float)fabs(c[1]), 1e-8f);
      const float p = c0 * c0 + c1 * c1;
      if (p > kBeta * psd[i] && p > 1e-6) {
        noise_tx->tx_block[2 * i + 0] *= (p - psd[i]) / AOMMAX(p, kEps);
        noise_tx->tx_block[2 * i + 1] *= (p - psd[i]) / AOMMAX(p, kEps);
      } else {
        noise_tx->tx_block[2 * i + 0] *= (kBeta - 1.0f) / kBeta;
        noise_tx->tx_block[2 * i + 1] *= (kBeta - 1.0f) / kBeta;
      }
    }
  }
}